

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_file.c
# Opt level: O2

gdIOCtx * gdNewFileCtx(FILE *f)

{
  gdIOCtx *pgVar1;
  
  if (f != (FILE *)0x0) {
    pgVar1 = (gdIOCtx *)gdMalloc(0x48);
    if (pgVar1 == (gdIOCtx *)0x0) {
      pgVar1 = (gdIOCtx *)0x0;
    }
    else {
      pgVar1[1].getC = (_func_int_gdIOCtx_ptr *)f;
      pgVar1->getC = fileGetchar;
      pgVar1->putC = filePutchar;
      pgVar1->getBuf = fileGetbuf;
      pgVar1->putBuf = filePutbuf;
      pgVar1->tell = fileTell;
      pgVar1->seek = fileSeek;
      pgVar1->gd_free = gdFreeFileCtx;
    }
    return pgVar1;
  }
  return (gdIOCtx *)0x0;
}

Assistant:

BGD_DECLARE(gdIOCtx *) gdNewFileCtx(FILE *f)
{
	fileIOCtx *ctx;

	if (f == NULL) return NULL;
	ctx = (fileIOCtx *)gdMalloc(sizeof(fileIOCtx));
	if(ctx == NULL) {
		return NULL;
	}

	ctx->f = f;

	ctx->ctx.getC = fileGetchar;
	ctx->ctx.putC = filePutchar;

	ctx->ctx.getBuf = fileGetbuf;
	ctx->ctx.putBuf = filePutbuf;

	ctx->ctx.tell = fileTell;
	ctx->ctx.seek = fileSeek;

	ctx->ctx.gd_free = gdFreeFileCtx;

	return (gdIOCtx *)ctx;
}